

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_MOVT(DisasContext_conflict1 *s,arg_MOVW *a)

{
  int reg;
  ulong uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  
  uVar1 = s->features;
  if ((uVar1 & 0x40) != 0) {
    s_00 = s->uc->tcg_ctx;
    reg = a->rd;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,var,reg);
    tcg_gen_ext16u_i32_aarch64(s_00,var,var);
    tcg_gen_ori_i32_aarch64(s_00,var,var,a->imm << 0x10);
    store_reg(s,a->rd,var);
  }
  return SUB41(((uint)uVar1 & 0x40) >> 6,0);
}

Assistant:

static bool trans_MOVT(DisasContext *s, arg_MOVW *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }

    tmp = load_reg(s, a->rd);
    tcg_gen_ext16u_i32(tcg_ctx, tmp, tmp);
    tcg_gen_ori_i32(tcg_ctx, tmp, tmp, a->imm << 16);
    store_reg(s, a->rd, tmp);
    return true;
}